

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O3

uint32_t __thiscall
glslang::TDefaultIoResolverBase::computeTypeLocationSize
          (TDefaultIoResolverBase *this,TType *type,EShLanguage stage)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  TType elementType;
  TType local_b0;
  
  iVar2 = (*type->_vptr_TType[0xb])(type);
  bVar1 = TQualifier::isArrayedIo((TQualifier *)CONCAT44(extraout_var,iVar2),stage);
  if (bVar1) {
    TType::TType(&local_b0,type,0,false);
    uVar3 = TIntermediate::computeTypeLocationSize(&local_b0,stage);
    return uVar3;
  }
  uVar3 = TIntermediate::computeTypeLocationSize(type,stage);
  return uVar3;
}

Assistant:

uint32_t TDefaultIoResolverBase::computeTypeLocationSize(const TType& type, EShLanguage stage) {
    int typeLocationSize;
    // Don’t take into account the outer-most array if the stage’s
    // interface is automatically an array.
    if (type.getQualifier().isArrayedIo(stage)) {
        TType elementType(type, 0);
        typeLocationSize = TIntermediate::computeTypeLocationSize(elementType, stage);
    } else {
        typeLocationSize = TIntermediate::computeTypeLocationSize(type, stage);
    }
    return typeLocationSize;
}